

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::detail::FormatArg::formatImpl<char[12]>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  size_t sVar1;
  ulong uVar2;
  
  if (fmtEnd[-1] == 'p') {
    std::ostream::_M_insert<void_const*>(out);
    return;
  }
  if (ntrunc < 0) {
    sVar1 = strlen((char *)value);
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)value,sVar1);
    return;
  }
  if (ntrunc != 0) {
    uVar2 = 0;
    do {
      if (*(char *)((long)value + uVar2) == '\0') break;
      uVar2 = uVar2 + 1;
    } while ((uint)ntrunc != uVar2);
  }
  std::ostream::write((char *)out,(long)value);
  return;
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }